

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_aa32_ld_i64(DisasContext_conflict1 *s,TCGv_i64 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 addr_00;
  TCGv_i64 addr;
  TCGContext_conflict1 *tcg_ctx;
  MemOp opc_local;
  int index_local;
  TCGv_i32 a32_local;
  TCGv_i64 val_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  addr_00 = gen_aa32_addr(s,a32,opc);
  tcg_gen_qemu_ld_i64_aarch64(tcg_ctx_00,val,addr_00,(long)index,opc);
  gen_aa32_frob64(s,val);
  tcg_temp_free_i64(tcg_ctx_00,addr_00);
  return;
}

Assistant:

static void gen_aa32_ld_i64(DisasContext *s, TCGv_i64 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr = gen_aa32_addr(s, a32, opc);
    tcg_gen_qemu_ld_i64(tcg_ctx, val, addr, index, opc);
    gen_aa32_frob64(s, val);
    tcg_temp_free(tcg_ctx, addr);
}